

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPTCPTransmitter::WaitForIncomingData
          (RTPTCPTransmitter *this,RTPTime *delay,bool *dataavailable)

{
  vector<signed_char,_std::allocator<signed_char>_> *this_00;
  SocketType SVar1;
  SocketType *sockets;
  pointer pcVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar3 = -0xb5;
  if (((this->m_init == true) && (iVar3 = -0xbb, this->m_created == true)) &&
     (iVar3 = -0xba, this->m_waitingForData == false)) {
    std::vector<int,_std::allocator<int>_>::resize
              (&this->m_tmpSocks,
               (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1);
    this_00 = &this->m_tmpFlags;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              (this_00,(long)(this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 2);
    p_Var4 = (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    SVar1 = this->m_pAbortDesc->m_descriptors[0];
    uVar6 = 0;
    while ((_Rb_tree_header *)p_Var4 != &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header) {
      (this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = p_Var4[1]._M_color;
      (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar6] = '\0';
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      uVar6 = uVar6 + 1;
    }
    uVar6 = uVar6 & 0xffffffff;
    (this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_start[uVar6] = SVar1;
    (this->m_tmpFlags).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = '\0';
    this->m_waitingForData = true;
    sockets = (this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar3 = RTPSelect(sockets,(this->m_tmpFlags).
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                      (long)(this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_finish - (long)sockets >> 2,
                      (RTPTime)delay->m_t);
    this->m_waitingForData = false;
    if ((-1 < iVar3) && (iVar3 = 0, this->m_created == true)) {
      if ((this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar6] != '\0') {
        RTPAbortDescriptors::ReadSignallingByte(this->m_pAbortDesc);
      }
      iVar3 = 0;
      if (dataavailable != (bool *)0x0) {
        pcVar2 = (this->m_tmpFlags).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)(this->m_tmpFlags).
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar2;
        uVar6 = 0;
        do {
          uVar7 = uVar6;
          if (uVar5 == uVar7) break;
          uVar6 = uVar7 + 1;
        } while (pcVar2[uVar7] == '\0');
        *dataavailable = uVar7 < uVar5;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int RTPTCPTransmitter::WaitForIncomingData(const RTPTime &delay,bool *dataavailable)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	if (m_waitingForData)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_ALREADYWAITING;
	}
	
	m_tmpSocks.resize(m_destSockets.size()+1);
	m_tmpFlags.resize(m_tmpSocks.size());
	SocketType abortSocket = m_pAbortDesc->GetAbortSocket();

	std::map<SocketType, SocketData>::iterator it = m_destSockets.begin();
	std::map<SocketType, SocketData>::iterator end = m_destSockets.end();
	int idx = 0;

	while (it != end)
	{
		m_tmpSocks[idx] = it->first;
		m_tmpFlags[idx] = 0;
		++it;
		idx++;
	}
	m_tmpSocks[idx] = abortSocket;
	m_tmpFlags[idx] = 0;
	int idxAbort = idx;

	m_waitingForData = true;
	
	WAITMUTEX_LOCK
	MAINMUTEX_UNLOCK

	//cout << "Waiting for " << delay.GetDouble() << " seconds for data on " << m_tmpSocks.size() << " sockets" << endl;
	int status = RTPSelect(&m_tmpSocks[0], &m_tmpFlags[0], m_tmpSocks.size(), delay);
	if (status < 0)
	{
		MAINMUTEX_LOCK
		m_waitingForData = false;
		MAINMUTEX_UNLOCK
		WAITMUTEX_UNLOCK
		return status;
	}
	
	MAINMUTEX_LOCK
	m_waitingForData = false;
	if (!m_created) // destroy called
	{
		MAINMUTEX_UNLOCK;
		WAITMUTEX_UNLOCK
		return 0;
	}
		
	// if aborted, read from abort buffer
	if (m_tmpFlags[idxAbort])
		m_pAbortDesc->ReadSignallingByte();

	if (dataavailable != 0)
	{
		bool avail = false;

		for (size_t i = 0 ; i < m_tmpFlags.size() ; i++)
		{
			if (m_tmpFlags[i])
			{
				avail = true;
				//cout << "Data available!" << endl;
				break;
			}
		}

		if (avail)
			*dataavailable = true;
		else
			*dataavailable = false;
	}	
	
	MAINMUTEX_UNLOCK
	WAITMUTEX_UNLOCK
	return 0;
}